

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

uint8_t * icu_63::BytesTrie::findUniqueValueFromBranch
                    (uint8_t *pos,int32_t length,UBool haveUniqueValue,int32_t *uniqueValue)

{
  byte bVar1;
  bool bVar2;
  UBool UVar3;
  int32_t iVar4;
  uint8_t *puVar5;
  UBool UVar6;
  uint8_t *puVar7;
  int iVar8;
  
  puVar7 = pos;
  if (5 < length) {
    do {
      puVar5 = jumpByDelta(puVar7 + 1);
      puVar5 = findUniqueValueFromBranch(puVar5,(uint)length >> 1,haveUniqueValue,uniqueValue);
      if (puVar5 == (uint8_t *)0x0) {
        return (uint8_t *)0x0;
      }
      pos = puVar7 + 2;
      bVar1 = puVar7[1];
      if (0xbf < bVar1) {
        if (bVar1 < 0xf0) {
          pos = puVar7 + 3;
        }
        else if (bVar1 < 0xfe) {
          pos = puVar7 + 4;
        }
        else {
          pos = pos + (ulong)(bVar1 & 1) + 3;
        }
      }
      length = length - ((uint)length >> 1);
      puVar7 = pos;
    } while (5 < length);
  }
  iVar8 = length + 1;
  do {
    puVar7 = pos + 2;
    bVar1 = pos[1];
    iVar4 = readValue(puVar7,(uint)(bVar1 >> 1));
    if (0xa1 < bVar1) {
      if (bVar1 < 0xd8) {
        puVar7 = pos + 3;
      }
      else if (bVar1 < 0xfc) {
        puVar7 = pos + 4;
      }
      else {
        puVar7 = puVar7 + (ulong)(bVar1 >> 1 & 1) + 3;
      }
    }
    if ((bVar1 & 1) == 0) {
      UVar3 = findUniqueValue(puVar7 + iVar4,haveUniqueValue,uniqueValue);
      UVar6 = '\x01';
      if (UVar3 != '\0') goto LAB_002e0cec;
LAB_002e0cd4:
      bVar2 = false;
    }
    else {
      if (haveUniqueValue == '\0') {
        *uniqueValue = iVar4;
        UVar6 = '\x01';
      }
      else {
        UVar6 = haveUniqueValue;
        if (iVar4 != *uniqueValue) goto LAB_002e0cd4;
      }
LAB_002e0cec:
      bVar2 = true;
      haveUniqueValue = UVar6;
    }
    if (!bVar2) {
      return (uint8_t *)0x0;
    }
    iVar8 = iVar8 + -1;
    pos = puVar7;
    if (iVar8 < 3) {
      return puVar7 + 1;
    }
  } while( true );
}

Assistant:

const uint8_t *
BytesTrie::findUniqueValueFromBranch(const uint8_t *pos, int32_t length,
                                     UBool haveUniqueValue, int32_t &uniqueValue) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison byte
        if(NULL==findUniqueValueFromBranch(jumpByDelta(pos), length>>1, haveUniqueValue, uniqueValue)) {
            return NULL;
        }
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        ++pos;  // ignore a comparison byte
        // handle its value
        int32_t node=*pos++;
        UBool isFinal=(UBool)(node&kValueIsFinal);
        int32_t value=readValue(pos, node>>1);
        pos=skipValue(pos, node);
        if(isFinal) {
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return NULL;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
        } else {
            if(!findUniqueValue(pos+value, haveUniqueValue, uniqueValue)) {
                return NULL;
            }
            haveUniqueValue=TRUE;
        }
    } while(--length>1);
    return pos+1;  // ignore the last comparison byte
}